

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O1

Future<LookupResponse> * __thiscall Future<LookupResponse>::get(Future<LookupResponse> *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long in_RSI;
  LookupResponse local_70 [8];
  undefined4 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if ((*(char *)(in_RSI + 0x70) == '\0') && (*(undefined8 **)(in_RSI + 8) != (undefined8 *)0x0)) {
    (**(code **)**(undefined8 **)(in_RSI + 8))(local_70);
    *(undefined4 *)(in_RSI + 0x20) = local_68;
    *(undefined8 *)(in_RSI + 0x30) = local_58;
    *(undefined8 *)(in_RSI + 0x38) = uStack_50;
    *(undefined8 *)(in_RSI + 0x40) = local_48;
    *(undefined8 *)(in_RSI + 0x48) = uStack_40;
    *(undefined8 *)(in_RSI + 0x50) = local_38;
    *(undefined8 *)(in_RSI + 0x58) = uStack_30;
    *(undefined8 *)(in_RSI + 0x60) = local_28;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x68),&local_20);
    LookupResponse::~LookupResponse(local_70);
    *(undefined1 *)(in_RSI + 0x70) = 1;
  }
  (this->super_AsyncTask<LookupResponse>)._vptr_AsyncTask = (_func_int **)FileInfo::FileInfo;
  *(undefined4 *)
   &(this->task_).super___shared_ptr<AsyncTask<LookupResponse>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(undefined4 *)(in_RSI + 0x20);
  (this->super_AsyncTask<LookupResponse>)._vptr_AsyncTask = (_func_int **)std::string::_S_construct;
  (this->task_).super___shared_ptr<AsyncTask<LookupResponse>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CrailOutputstream::Write;
  uVar2 = *(undefined8 *)(in_RSI + 0x38);
  uVar3 = *(undefined8 *)(in_RSI + 0x40);
  uVar4 = *(undefined8 *)(in_RSI + 0x48);
  uVar5 = *(undefined8 *)(in_RSI + 0x50);
  uVar6 = *(undefined8 *)(in_RSI + 0x58);
  *(undefined8 *)&this->result_ = *(undefined8 *)(in_RSI + 0x30);
  *(undefined8 *)&this->field_0x20 = uVar2;
  *(undefined8 *)&this->field_0x28 = uVar3;
  *(undefined8 *)&this->field_0x30 = uVar4;
  *(undefined8 *)&this->field_0x38 = uVar5;
  *(undefined8 *)&this->field_0x40 = uVar6;
  *(undefined8 *)&this->field_0x48 = *(undefined8 *)(in_RSI + 0x60);
  lVar1 = *(long *)(in_RSI + 0x68);
  *(long *)&this->field_0x50 = lVar1;
  if (lVar1 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    }
  }
  return this;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }